

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeParseCellPtr(MemPage *pPage,u8 *pCell,CellInfo *pInfo)

{
  ushort uVar1;
  byte bVar2;
  int iVar3;
  u64 *in_RDX;
  byte *in_RSI;
  long in_RDI;
  int surplus;
  int maxLocal;
  int minLocal;
  u32 nPayload;
  u8 *pIter;
  uint local_40;
  uint local_3c;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  byte *local_20;
  
  if (*(char *)(in_RDI + 3) == '\0') {
    if (*(char *)(in_RDI + 4) != '\0') {
      bVar2 = sqlite3GetVarint(in_RSI + 4,in_RDX);
      *(ushort *)(in_RDX + 3) = bVar2 + 4;
      *(undefined4 *)(in_RDX + 2) = 0;
      *(undefined2 *)((long)in_RDX + 0x14) = 0;
      *(undefined2 *)((long)in_RDX + 0x16) = 0;
      in_RDX[1] = 0;
      return;
    }
    local_20 = in_RSI + (int)(uint)*(byte *)(in_RDI + 7);
    if (*local_20 < 0x80) {
      in_stack_ffffffffffffffdc = (uint)*local_20;
      local_40 = 1;
    }
    else {
      bVar2 = sqlite3GetVarint32((uchar *)CONCAT44(in_stack_ffffffffffffffdc,
                                                   in_stack_ffffffffffffffd8),
                                 (u32 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0
                                                ));
      local_40 = (uint)bVar2;
    }
    local_20 = local_20 + (int)local_40;
    *in_RDX = (ulong)in_stack_ffffffffffffffdc;
  }
  else {
    if (*in_RSI < 0x80) {
      in_stack_ffffffffffffffdc = (uint)*in_RSI;
      local_3c = 1;
    }
    else {
      bVar2 = sqlite3GetVarint32((uchar *)CONCAT44(in_stack_ffffffffffffffdc,
                                                   in_stack_ffffffffffffffd8),
                                 (u32 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0
                                                ));
      local_3c = (uint)bVar2;
    }
    bVar2 = sqlite3GetVarint(in_RSI + (int)local_3c,in_RDX);
    local_20 = in_RSI + (int)local_3c + (int)(uint)bVar2;
  }
  *(uint *)(in_RDX + 2) = in_stack_ffffffffffffffdc;
  in_RDX[1] = (u64)local_20;
  if (*(ushort *)(in_RDI + 10) < in_stack_ffffffffffffffdc) {
    uVar1 = *(ushort *)(in_RDI + 0xc);
    iVar3 = (uint)uVar1 +
            (in_stack_ffffffffffffffdc - uVar1) % (*(int *)(*(long *)(in_RDI + 0x48) + 0x34) - 4U);
    if ((int)(uint)*(ushort *)(in_RDI + 10) < iVar3) {
      *(ushort *)((long)in_RDX + 0x14) = uVar1;
    }
    else {
      *(short *)((long)in_RDX + 0x14) = (short)iVar3;
    }
    *(short *)((long)in_RDX + 0x16) =
         ((short)in_RDX[1] + *(short *)((long)in_RDX + 0x14)) - (short)in_RSI;
    *(short *)(in_RDX + 3) = *(short *)((long)in_RDX + 0x16) + 4;
  }
  else {
    *(short *)(in_RDX + 3) = (short)in_stack_ffffffffffffffdc + ((short)local_20 - (short)in_RSI);
    if ((ushort)in_RDX[3] < 4) {
      *(undefined2 *)(in_RDX + 3) = 4;
    }
    *(short *)((long)in_RDX + 0x14) = (short)in_stack_ffffffffffffffdc;
    *(undefined2 *)((long)in_RDX + 0x16) = 0;
  }
  return;
}

Assistant:

static void btreeParseCellPtr(
  MemPage *pPage,         /* Page containing the cell */
  u8 *pCell,              /* Pointer to the cell text. */
  CellInfo *pInfo         /* Fill in this structure */
){
  u8 *pIter;              /* For scanning through pCell */
  u32 nPayload;           /* Number of bytes of cell payload */

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->leaf==0 || pPage->leaf==1 );
  if( pPage->intKeyLeaf ){
    assert( pPage->childPtrSize==0 );
    pIter = pCell + getVarint32(pCell, nPayload);
    pIter += getVarint(pIter, (u64*)&pInfo->nKey);
  }else if( pPage->noPayload ){
    assert( pPage->childPtrSize==4 );
    pInfo->nSize = 4 + getVarint(&pCell[4], (u64*)&pInfo->nKey);
    pInfo->nPayload = 0;
    pInfo->nLocal = 0;
    pInfo->iOverflow = 0;
    pInfo->pPayload = 0;
    return;
  }else{
    pIter = pCell + pPage->childPtrSize;
    pIter += getVarint32(pIter, nPayload);
    pInfo->nKey = nPayload;
  }
  pInfo->nPayload = nPayload;
  pInfo->pPayload = pIter;
  testcase( nPayload==pPage->maxLocal );
  testcase( nPayload==pPage->maxLocal+1 );
  if( nPayload<=pPage->maxLocal ){
    /* This is the (easy) common case where the entire payload fits
    ** on the local page.  No overflow is required.
    */
    pInfo->nSize = nPayload + (u16)(pIter - pCell);
    if( pInfo->nSize<4 ) pInfo->nSize = 4;
    pInfo->nLocal = (u16)nPayload;
    pInfo->iOverflow = 0;
  }else{
    /* If the payload will not fit completely on the local page, we have
    ** to decide how much to store locally and how much to spill onto
    ** overflow pages.  The strategy is to minimize the amount of unused
    ** space on overflow pages while keeping the amount of local storage
    ** in between minLocal and maxLocal.
    **
    ** Warning:  changing the way overflow payload is distributed in any
    ** way will result in an incompatible file format.
    */
    int minLocal;  /* Minimum amount of payload held locally */
    int maxLocal;  /* Maximum amount of payload held locally */
    int surplus;   /* Overflow payload available for local storage */

    minLocal = pPage->minLocal;
    maxLocal = pPage->maxLocal;
    surplus = minLocal + (nPayload - minLocal)%(pPage->pBt->usableSize - 4);
    testcase( surplus==maxLocal );
    testcase( surplus==maxLocal+1 );
    if( surplus <= maxLocal ){
      pInfo->nLocal = (u16)surplus;
    }else{
      pInfo->nLocal = (u16)minLocal;
    }
    pInfo->iOverflow = (u16)(&pInfo->pPayload[pInfo->nLocal] - pCell);
    pInfo->nSize = pInfo->iOverflow + 4;
  }
}